

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O1

int __thiscall NetOptimize::eliminate_noop(NetOptimize *this)

{
  int iVar1;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *pvVar2;
  Layer *pLVar3;
  int *piVar4;
  Layer *pLVar5;
  int iVar6;
  uint uVar7;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  bool bVar17;
  ulong uVar8;
  
  pvVar2 = (this->super_ModelWriter).layers;
  lVar14 = (long)(pvVar2->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)(pvVar2->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                 .super__Vector_impl_data._M_start;
  if (lVar14 != 0) {
    lVar14 = lVar14 >> 3;
    uVar16 = 0;
    do {
      iVar6 = std::__cxx11::string::compare
                        ((char *)&(((this->super_ModelWriter).layers)->
                                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)
                                  ._M_impl.super__Vector_impl_data._M_start[uVar16]->type);
      if (iVar6 == 0) {
        pLVar3 = (((this->super_ModelWriter).layers)->
                 super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar16];
        piVar4 = (pLVar3->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (piVar4 == *(pointer *)
                       ((long)&(pLVar3->bottoms).super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl + 8)) {
          eliminate_noop();
        }
        else {
          uVar7 = (int)uVar16 - 1;
          uVar15 = uVar16;
          if ((int)uVar7 < 0) {
            iVar6 = -1;
          }
          else {
            iVar1 = *piVar4;
            uVar12 = 0xffffffff;
            do {
              uVar8 = (ulong)uVar7;
              iVar6 = std::__cxx11::string::compare
                                ((char *)&(((this->super_ModelWriter).layers)->
                                          super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                          )._M_impl.super__Vector_impl_data._M_start[uVar8]->type);
              if (iVar6 != 0) {
                pLVar5 = (((this->super_ModelWriter).layers)->
                         super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                         super__Vector_impl_data._M_start[uVar8];
                piVar4 = (pLVar5->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
                lVar9 = (long)*(pointer *)
                               ((long)&(pLVar5->tops).super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl + 8) - (long)piVar4;
                bVar17 = lVar9 != 0;
                uVar13 = uVar12;
                if (bVar17) {
                  uVar10 = lVar9 >> 2;
                  uVar13 = 0;
                  if (*piVar4 != iVar1) {
                    uVar11 = 0;
                    do {
                      if ((uVar10 + (uVar10 == 0)) - 1 == uVar11) {
                        bVar17 = uVar11 + 1 < uVar10;
                        uVar13 = uVar12;
                        goto LAB_00138490;
                      }
                      uVar13 = uVar11 + 1;
                      lVar9 = uVar11 + 1;
                      uVar11 = uVar13;
                    } while (piVar4[lVar9] != iVar1);
                    bVar17 = uVar13 < uVar10;
                  }
                }
LAB_00138490:
                iVar6 = (int)uVar13;
                uVar12 = uVar13;
                if (bVar17) goto LAB_001384c5;
              }
              iVar6 = (int)uVar12;
              uVar12 = uVar12 & 0xffffffff;
              bVar17 = 0 < (int)uVar7;
              uVar15 = uVar8;
              uVar7 = uVar7 - 1;
            } while (bVar17);
            uVar7 = 0xffffffff;
            uVar15 = 0;
          }
LAB_001384c5:
          if (((int)uVar15 == 0) || (iVar6 == -1)) goto LAB_00138575;
          pLVar5 = (((this->super_ModelWriter).layers)->
                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                   super__Vector_impl_data._M_start[(int)uVar7];
          fprintf(_stderr,"eliminate_noop %s %s\n",(pLVar5->name)._M_dataplus._M_p,
                  (pLVar3->name)._M_dataplus._M_p);
          iVar1 = *(pLVar3->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          *(int *)(*(long *)&(pLVar5->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data + (long)iVar6 * 4) = iVar1;
          (((this->super_ModelWriter).blobs)->
          super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>)._M_impl.
          super__Vector_impl_data._M_start[iVar1].producer = uVar7;
        }
        std::__cxx11::string::_M_replace
                  ((ulong)&pLVar3->type,0,(char *)(pLVar3->type)._M_string_length,0x5fd19a);
      }
LAB_00138575:
      uVar16 = uVar16 + 1;
    } while (uVar16 != lVar14 + (ulong)(lVar14 == 0));
  }
  return 0;
}

Assistant:

int NetOptimize::eliminate_noop()
{
    const size_t layer_count = layers.size();
    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "Noop")
            continue;

        ncnn::Layer* noop = layers[i];

        if (noop->bottoms.empty())
        {
            // Noop
            fprintf(stderr, "eliminate_noop %s\n", noop->name.c_str());

            size_t top_blob_count = noop->tops.size();
            for (size_t j = 0; j < top_blob_count; j++)
            {
                int top_blob_index_final = noop->tops[j];
                blobs[top_blob_index_final].producer = -1;
            }
            noop->type = "ncnnfused";

            continue;
        }

        // Any - Noop
        int bottom_blob_index = noop->bottoms[0];

        int j = i - 1;
        int any_k = -1;
        for (; j >= 0; j--)
        {
            if (layers[j]->type == "ncnnfused")
                continue;

            bool link_noop = false;
            size_t top_blob_count = layers[j]->tops.size();
            for (size_t k = 0; k < top_blob_count; k++)
            {
                if (layers[j]->tops[k] == bottom_blob_index)
                {
                    link_noop = true;
                    any_k = k;
                    break;
                }
            }

            if (link_noop)
                break;
        }

        if (j == -1 || any_k == -1)
            continue;

        ncnn::Layer* any = layers[j];

        fprintf(stderr, "eliminate_noop %s %s\n", any->name.c_str(), noop->name.c_str());

        int top_blob_index_final = noop->tops[0];
        any->tops[any_k] = top_blob_index_final;
        blobs[top_blob_index_final].producer = j;

        noop->type = "ncnnfused";
    }

    return 0;
}